

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

int dsa_pub_encode(CBB *out,EVP_PKEY *key)

{
  DSA *dsa;
  int iVar1;
  bool bVar2;
  CBB key_bitstring;
  CBB algorithm;
  CBB spki;
  CBB CStack_a8;
  CBB local_78;
  CBB local_48;
  
  dsa = (DSA *)key->pkey;
  if ((dsa->p == (BIGNUM *)0x0) || (dsa->q == (BIGNUM *)0x0)) {
    bVar2 = false;
  }
  else {
    bVar2 = dsa->g != (BIGNUM *)0x0;
  }
  iVar1 = CBB_add_asn1(out,&local_48,0x20000010);
  if ((((((iVar1 != 0) && (iVar1 = CBB_add_asn1(&local_48,&local_78,0x20000010), iVar1 != 0)) &&
        (iVar1 = CBB_add_asn1_element(&local_78,6,dsa_asn1_meth.oid,7), iVar1 != 0)) &&
       ((!bVar2 || (iVar1 = DSA_marshal_parameters(&local_78,dsa), iVar1 != 0)))) &&
      ((iVar1 = CBB_add_asn1(&local_48,&CStack_a8,3), iVar1 != 0 &&
       ((iVar1 = CBB_add_u8(&CStack_a8,'\0'), iVar1 != 0 &&
        (iVar1 = BN_marshal_asn1(&CStack_a8,dsa->pub_key), iVar1 != 0)))))) &&
     (iVar1 = CBB_flush(out), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,0x4a);
  return 0;
}

Assistant:

static int dsa_pub_encode(CBB *out, const EVP_PKEY *key) {
  const DSA *dsa = reinterpret_cast<const DSA *>(key->pkey);
  const int has_params =
      dsa->p != nullptr && dsa->q != nullptr && dsa->g != nullptr;

  // See RFC 5480, section 2.
  CBB spki, algorithm, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, dsa_asn1_meth.oid,
                            dsa_asn1_meth.oid_len) ||
      (has_params && !DSA_marshal_parameters(&algorithm, dsa)) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !BN_marshal_asn1(&key_bitstring, dsa->pub_key) || !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}